

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O2

void __thiscall jpgd::jpeg_decoder::read_sos_marker(jpeg_decoder *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar2 = get_bits(this,0x10);
  uVar3 = get_bits(this,8);
  this->m_comps_in_scan = uVar3;
  if ((0xfffffffb < uVar3 - 5) && (uVar2 == uVar3 * 2 + 6)) {
    iVar6 = uVar2 - 3;
    uVar7 = 0;
    do {
      uVar2 = get_bits(this,8);
      if (uVar7 == uVar3) {
        this->m_spectral_start = uVar2;
        uVar2 = get_bits(this,8);
        this->m_spectral_end = uVar2;
        uVar2 = get_bits(this,4);
        this->m_successive_high = uVar2;
        uVar2 = get_bits(this,4);
        this->m_successive_low = uVar2;
        if (this->m_progressive_flag == 0) {
          this->m_spectral_start = 0;
          this->m_spectral_end = 0x3f;
        }
        iVar6 = iVar6 + -3;
        while (bVar8 = iVar6 != 0, iVar6 = iVar6 + -1, bVar8) {
          get_bits(this,8);
        }
        return;
      }
      uVar4 = get_bits(this,8);
      iVar6 = iVar6 + -2;
      uVar1 = this->m_comps_in_frame;
      if (this->m_comps_in_frame < 1) {
        uVar1 = 0;
      }
      uVar5 = 0;
      while( true ) {
        if (uVar1 == uVar5) {
          stop_decoding(this,JPGD_BAD_SOS_COMP_ID);
        }
        if (uVar2 == this->m_comp_ident[uVar5]) break;
        uVar5 = uVar5 + 1;
      }
      this->m_comp_list[uVar7] = (int)uVar5;
      this->m_comp_dc_tab[uVar5] = uVar4 >> 4 & 0xf;
      this->m_comp_ac_tab[uVar5] = (uVar4 & 0xf) + 4;
      uVar7 = uVar7 + 1;
    } while( true );
  }
  stop_decoding(this,JPGD_BAD_SOS_LENGTH);
}

Assistant:

void jpeg_decoder::read_sos_marker() {
  uint num_left;
  int i, ci, n, c, cc;

  num_left = get_bits(16);

  n = get_bits(8);

  m_comps_in_scan = n;

  num_left -= 3;

  if ((num_left != (uint)(n * 2 + 3)) || (n < 1) || (n > JPGD_MAX_COMPS_IN_SCAN))
    stop_decoding(JPGD_BAD_SOS_LENGTH);

  for (i = 0; i < n; i++) {
    cc = get_bits(8);
    c = get_bits(8);
    num_left -= 2;

    for (ci = 0; ci < m_comps_in_frame; ci++)
      if (cc == m_comp_ident[ci])
        break;

    if (ci >= m_comps_in_frame)
      stop_decoding(JPGD_BAD_SOS_COMP_ID);

    m_comp_list[i] = ci;
    m_comp_dc_tab[ci] = (c >> 4) & 15;
    m_comp_ac_tab[ci] = (c & 15) + (JPGD_MAX_HUFF_TABLES >> 1);
  }

  m_spectral_start = get_bits(8);
  m_spectral_end = get_bits(8);
  m_successive_high = get_bits(4);
  m_successive_low = get_bits(4);

  if (!m_progressive_flag) {
    m_spectral_start = 0;
    m_spectral_end = 63;
  }

  num_left -= 3;

  while (num_left) /* read past whatever is num_left */
  {
    get_bits(8);
    num_left--;
  }
}